

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_ObjSetCi(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  Wlc_Obj_t *pWVar6;
  long lVar7;
  int i;
  
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3d) != (undefined1  [24])0x1)
  {
    __assert_fail("Wlc_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                  ,0xa9,"void Wlc_ObjSetCi(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  if (pObj->nFanins == 0) {
    uVar1 = (p->vPis).nSize;
    uVar2 = (p->vCis).nSize;
    if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3) == (undefined1  [24])0x1
        && uVar1 != uVar2) {
      pWVar6 = p->pObjs;
      if (((int)uVar1 < 0) || ((int)uVar2 < (int)uVar1)) {
        __assert_fail("iHere >= 0 && iHere <= p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x41c,"void Vec_IntInsert(Vec_Int_t *, int, int)");
      }
      Vec_IntPush(&p->vCis,0);
      lVar4 = (long)(p->vCis).nSize;
      piVar3 = (p->vCis).pArray;
      lVar5 = lVar4 << 0x20;
      while( true ) {
        lVar7 = lVar4 + -1;
        lVar5 = lVar5 + -0x100000000;
        if (lVar7 <= (long)(ulong)uVar1) break;
        piVar3[lVar7] = piVar3[lVar4 + -2];
        lVar4 = lVar7;
      }
      *(int *)((long)piVar3 + (lVar5 >> 0x1e)) = (int)(((long)pObj - (long)pWVar6) / 0x18);
      for (i = 0; i < (p->vCis).nSize; i = i + 1) {
        pWVar6 = Wlc_NtkCi(p,i);
        (pWVar6->field_10).Fanins[1] = i;
      }
    }
    else {
      (pObj->field_10).Fanins[1] = uVar2;
      Vec_IntPush(&p->vCis,(int)(((long)pObj - (long)p->pObjs) / 0x18));
    }
    if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x1) {
      Vec_IntPush(&p->vPis,(int)(((long)pObj - (long)p->pObjs) / 0x18));
      return;
    }
    return;
  }
  __assert_fail("Wlc_ObjFaninNum(pObj) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                ,0xaa,"void Wlc_ObjSetCi(Wlc_Ntk_t *, Wlc_Obj_t *)");
}

Assistant:

void Wlc_ObjSetCi( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    assert( Wlc_ObjIsCi(pObj) );
    assert( Wlc_ObjFaninNum(pObj) == 0 );
    if ( Wlc_NtkPiNum(p) == Wlc_NtkCiNum(p) || pObj->Type != WLC_OBJ_PI )
    {
        pObj->Fanins[1] = Vec_IntSize(&p->vCis);
        Vec_IntPush( &p->vCis, Wlc_ObjId(p, pObj) );
    }
    else // insert in the array of CI at the end of PIs
    {
        Wlc_Obj_t * pTemp; int i;
        Vec_IntInsert( &p->vCis, Wlc_NtkPiNum(p), Wlc_ObjId(p, pObj) );
        // other CI IDs are invalidated... naive fix!
        Wlc_NtkForEachCi( p, pTemp, i )
            pTemp->Fanins[1] = i;
    }
    if ( pObj->Type == WLC_OBJ_PI )
        Vec_IntPush( &p->vPis, Wlc_ObjId(p, pObj) );
}